

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.h
# Opt level: O2

JavascriptAsyncSpawnStepFunction *
Js::VarTo<Js::JavascriptAsyncSpawnStepFunction,Js::RecyclableObject>(RecyclableObject *obj)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  bVar2 = VarIsImpl<Js::JavascriptAsyncSpawnStepFunction>(obj);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/RecyclableObject.h"
                                ,0x208,"(VarIs<T>(obj))","VarIs<T>(obj)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return (JavascriptAsyncSpawnStepFunction *)obj;
}

Assistant:

T* VarTo(U* obj)
    {
        AssertOrFailFast(VarIs<T>(obj));
        return static_cast<T*>(obj);
    }